

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

ssize_t Curl_bufq_write(bufq *q,uchar *buf,size_t len,CURLcode *err)

{
  buf_chunk *pbVar1;
  ssize_t sVar2;
  CURLcode CVar3;
  long lVar4;
  ulong __n;
  bool bVar5;
  
  bVar5 = len != 0;
  if (len == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    do {
      pbVar1 = get_non_full_tail(q);
      if (pbVar1 == (buf_chunk *)0x0) {
        sVar2 = -1;
        CVar3 = CURLE_OUT_OF_MEMORY;
        if ((q->chunk_count < q->max_chunks) || ((q->opts & 1) != 0)) goto LAB_00112978;
        break;
      }
      __n = pbVar1->dlen - pbVar1->w_offset;
      if (__n == 0) {
        __n = 0;
      }
      else {
        if (len <= __n) {
          __n = len;
        }
        memcpy((void *)((long)&pbVar1->x + pbVar1->w_offset),buf,__n);
        pbVar1->w_offset = pbVar1->w_offset + __n;
      }
      if (__n == 0) break;
      lVar4 = lVar4 + __n;
      buf = buf + __n;
      len = len - __n;
      bVar5 = len != 0;
    } while (bVar5);
  }
  bVar5 = (bool)(bVar5 & lVar4 == 0);
  CVar3 = CURLE_OK;
  if (bVar5) {
    CVar3 = CURLE_AGAIN;
  }
  sVar2 = -1;
  if (!bVar5) {
    sVar2 = lVar4;
  }
LAB_00112978:
  *err = CVar3;
  return sVar2;
}

Assistant:

ssize_t Curl_bufq_write(struct bufq *q,
                        const unsigned char *buf, size_t len,
                        CURLcode *err)
{
  struct buf_chunk *tail;
  ssize_t nwritten = 0;
  size_t n;

  DEBUGASSERT(q->max_chunks > 0);
  while(len) {
    tail = get_non_full_tail(q);
    if(!tail) {
      if((q->chunk_count < q->max_chunks) || (q->opts & BUFQ_OPT_SOFT_LIMIT)) {
        *err = CURLE_OUT_OF_MEMORY;
        return -1;
      }
      break;
    }
    n = chunk_append(tail, buf, len);
    if(!n)
      break;
    nwritten += n;
    buf += n;
    len -= n;
  }
  if(nwritten == 0 && len) {
    *err = CURLE_AGAIN;
    return -1;
  }
  *err = CURLE_OK;
  return nwritten;
}